

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_61(QPDF *pdf,char *arg2)

{
  ExtendNameTree *this;
  long local_270;
  long local_260;
  QPDFObjectHandle local_218;
  ExtendNameTree *local_208;
  QPDFNameTreeObjectHelper *n;
  Pipeline *p;
  Pl_Discard pd;
  InputSource *is;
  string local_1b8 [39];
  allocator<char> local_191;
  string local_190 [32];
  BufferInputSource local_170 [8];
  BufferInputSource b;
  runtime_error *anon_var_0_3;
  logic_error *anon_var_0_2;
  QPDFSystemError *anon_var_0_1;
  QPDFExc *anon_var_0;
  char *local_18;
  char *arg2_local;
  QPDF *pdf_local;
  
  local_18 = arg2;
  arg2_local = (char *)pdf;
  QPDF::setAttemptRecovery(SUB81(pdf,0));
  QPDF::setSuppressWarnings(SUB81(arg2_local,0));
  QPDF::processMemoryFile(arg2_local,"empty",0x172a0e,(char *)0x0);
  QUtil::safe_fopen("/does/not/exist","r");
  QUtil::int_to_string_base_abi_cxx11_((longlong)&anon_var_0_2,0,0xc);
  std::__cxx11::string::~string((string *)&anon_var_0_2);
  QUtil::toUTF8_abi_cxx11_((ulong)&anon_var_0_3);
  std::__cxx11::string::~string((string *)&anon_var_0_3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"x",&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b8,"y",(allocator<char> *)((long)&is + 7));
  BufferInputSource::BufferInputSource(local_170,local_190,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&is + 7));
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  if (local_170 == (BufferInputSource *)0x0) {
    local_260 = 0;
  }
  else {
    local_260 = __dynamic_cast(local_170,&InputSource::typeinfo,&BufferInputSource::typeinfo,0);
  }
  if (local_260 == 0) {
    __assert_fail("dynamic_cast<BufferInputSource*>(is) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x8dd,"void test_61(QPDF &, const char *)");
  }
  Pl_Discard::Pl_Discard((Pl_Discard *)&p);
  n = (QPDFNameTreeObjectHelper *)&p;
  if (n == (QPDFNameTreeObjectHelper *)0x0) {
    local_270 = 0;
  }
  else {
    local_270 = __dynamic_cast(n,&Pipeline::typeinfo,&Pl_Discard::typeinfo,0);
  }
  if (local_270 != 0) {
    this = (ExtendNameTree *)operator_new(0x38);
    QPDFObjectHandle::newNull();
    ExtendNameTree::ExtendNameTree(this,&local_218,(QPDF *)arg2_local);
    QPDFObjectHandle::~QPDFObjectHandle(&local_218);
    local_208 = this;
    if (this != (ExtendNameTree *)0x0) {
      (**(code **)(*(long *)this + 8))();
    }
    Pl_Discard::~Pl_Discard((Pl_Discard *)&p);
    BufferInputSource::~BufferInputSource(local_170);
    return;
  }
  __assert_fail("dynamic_cast<Pl_Discard*>(p) != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x8e0,"void test_61(QPDF &, const char *)");
}

Assistant:

static void
test_61(QPDF& pdf, char const* arg2)
{
    // Test to make sure type information is passed across shared
    // library boundaries. This includes exception handling, dynamic
    // cast, and subclassing.
    pdf.setAttemptRecovery(false);
    pdf.setSuppressWarnings(true);
    try {
        pdf.processMemoryFile("empty", "", 0);
    } catch (QPDFExc const&) {
        std::cout << "Caught QPDFExc as expected" << std::endl;
    }
    try {
        QUtil::safe_fopen("/does/not/exist", "r");
    } catch (QPDFSystemError const&) {
        std::cout << "Caught QPDFSystemError as expected" << std::endl;
    }
    try {
        QUtil::int_to_string_base(0, 12);
    } catch (std::logic_error const&) {
        std::cout << "Caught logic_error as expected" << std::endl;
    }
    try {
        QUtil::toUTF8(0xffffffff);
    } catch (std::runtime_error const&) {
        std::cout << "Caught runtime_error as expected" << std::endl;
    }

    // Spot check RTTI for dynamic cast. We intend to have pipelines
    // and input sources be testable, but adding comprehensive tests
    // for everything doesn't add value as it wouldn't catch
    // forgetting QPDF_DLL_CLASS on a new subclass.
    BufferInputSource b("x", "y");
    InputSource* is = &b;
    assert(dynamic_cast<BufferInputSource*>(is) != nullptr);
    Pl_Discard pd;
    Pipeline* p = &pd;
    assert(dynamic_cast<Pl_Discard*>(p) != nullptr);

    // For some reason, QPDFNameTreeObjectHelper's vtable seems to
    // like to not make it into the shared library with mingw. Try to
    // make sure this is really fixed.
    QPDFNameTreeObjectHelper* n = new ExtendNameTree(QPDFObjectHandle::newNull(), pdf);
    delete n;
}